

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::QueuePushMethod::eval
          (QueuePushMethod *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  bool bVar1;
  SVQueue *this_00;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  long in_RSI;
  LValue *in_RDI;
  SVQueue *q;
  ConstantValue *target;
  ConstantValue cv;
  LValue lval;
  value_type *in_stack_fffffffffffffdc8;
  EvalContext *in_stack_fffffffffffffdd0;
  Expression *in_stack_fffffffffffffdd8;
  LValue *this_01;
  
  this_01 = in_RDI;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::evalLValue(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,1);
  Expression::eval(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  bVar1 = LValue::operator_cast_to_bool((LValue *)0x932068);
  if ((bVar1) &&
     (bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x932082), bVar1)) {
    LValue::resolve(this_01);
    this_00 = (SVQueue *)slang::ConstantValue::queue((ConstantValue *)0x93210b);
    CopyPtr<slang::SVQueue>::operator*((CopyPtr<slang::SVQueue> *)0x93211c);
    if ((*(byte *)(in_RSI + 0x38) & 1) == 0) {
      std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::push_back
                (&this_00->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,
                 in_stack_fffffffffffffdc8);
    }
    else {
      std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::push_front
                (&this_00->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,
                 in_stack_fffffffffffffdc8);
    }
    SVQueue::resizeToBound(this_00);
    slang::ConstantValue::ConstantValue((ConstantValue *)this_00,in_stack_fffffffffffffdc8);
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  }
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x932183);
  LValue::~LValue((LValue *)0x932190);
  return (ConstantValue *)in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto lval = args[0]->evalLValue(context);
        auto cv = args[1]->eval(context);
        if (!lval || !cv)
            return nullptr;

        auto target = lval.resolve();
        SLANG_ASSERT(target && target->isQueue());

        auto& q = *target->queue();
        if (front)
            q.push_front(std::move(cv));
        else
            q.push_back(std::move(cv));

        q.resizeToBound();
        return nullptr;
    }